

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((pX->rRun <= pY->rRun) || (iVar4 = 0, pX->nOut <= pY->nOut)) {
    if (((pX->u).btree.nEq < (pY->u).btree.nEq) &&
       ((((pX->u).btree.pIndex == (pY->u).btree.pIndex && (pX->nSkip == 0)) && (pY->nSkip == 0)))) {
      iVar4 = 1;
    }
    else {
      iVar3 = 0;
      iVar4 = iVar3;
      if (pY->nSkip <= pX->nSkip) {
        uVar5 = (ulong)pX->nLTerm;
        iVar4 = 0;
        if ((int)((uint)pX->nLTerm - (uint)pX->nSkip) < (int)((uint)pY->nLTerm - (uint)pY->nSkip)) {
          do {
            do {
              if ((long)uVar5 < 1) {
                if (((pX->wsFlags & 0x40) == 0) || ((pY->wsFlags & 0x40) != 0)) {
                  iVar3 = 1;
                }
                return iVar3;
              }
              lVar1 = uVar5 - 1;
              uVar5 = uVar5 - 1;
              uVar6 = (ulong)pY->nLTerm;
            } while (pX->aLTerm[lVar1] == (WhereTerm *)0x0);
            do {
              if ((long)uVar6 < 1) {
                return 0;
              }
              lVar2 = uVar6 - 1;
              uVar6 = uVar6 - 1;
            } while (pY->aLTerm[lVar2] != pX->aLTerm[lVar1]);
          } while( true );
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->rRun>pY->rRun && pX->nOut>pY->nOut ) return 0; /* (1d) and (2a) */
  assert( (pX->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pY->wsFlags & WHERE_VIRTUALTABLE)==0 );
  if( pX->u.btree.nEq < pY->u.btree.nEq                  /* (1b) */
   && pX->u.btree.pIndex==pY->u.btree.pIndex             /* (1a) */
   && pX->nSkip==0 && pY->nSkip==0                       /* (1c) */
  ){
    return 1;  /* Case 1 is true */
  }
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0;                                            /* (2b) */
  }
  if( pY->nSkip > pX->nSkip ) return 0;                  /* (2d) */
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;                                  /* (2c) */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;                                            /* (2e) */
  }
  return 1;  /* Case 2 is true */
}